

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

void __thiscall
QSQLiteDriver::handleNotification(QSQLiteDriver *this,QString *tableName,qint64 rowid)

{
  bool bVar1;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)(*(long *)(this + 8) + 200),tableName,
                     CaseSensitive);
  if (bVar1) {
    QVariant::QVariant(&QStack_48,rowid);
    QSqlDriver::notification((QString *)this,(NotificationSource)tableName,(QVariant *)0x0);
    QVariant::~QVariant(&QStack_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSQLiteDriver::handleNotification(const QString &tableName, qint64 rowid)
{
    Q_D(const QSQLiteDriver);
    if (d->notificationid.contains(tableName))
        emit notification(tableName, QSqlDriver::UnknownSource, QVariant(rowid));
}